

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryLayeredRenderingTests.cpp
# Opt level: O1

bool vkt::geometry::anon_unknown_0::verifyEmptyImage(TestLog *log,ConstPixelBufferAccess *image)

{
  ostringstream *poVar1;
  float fVar2;
  int i;
  int iVar3;
  long lVar4;
  TestLog *this;
  int iVar5;
  void *__buf;
  bool bVar6;
  bool bVar7;
  float fVar8;
  Vector<bool,_4> res_1;
  Vec4 color;
  Vec4 threshold;
  Vec4 black;
  Vector<float,_4> res;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  LogImageSet local_2b8;
  undefined1 local_278 [32];
  void *local_258;
  undefined8 uStack_250;
  LogImage local_248;
  undefined1 local_1b8 [392];
  
  poVar1 = (ostringstream *)(local_1b8 + 8);
  local_1b8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Expecting empty image",0x15)
  ;
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
  local_258 = (void *)0x0;
  uStack_250 = 0x3f80000000000000;
  lVar4 = 0;
  do {
    *(undefined4 *)(local_278 + lVar4 * 4 + 0x10) = 0x3ca3d70a;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  iVar3 = (image->m_size).m_data[1];
  bVar6 = iVar3 < 1;
  if (0 < iVar3) {
    iVar3 = 0;
    do {
      if (0 < (image->m_size).m_data[0]) {
        iVar5 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_278,(int)image,iVar5,iVar3);
          local_248.m_name._M_dataplus._M_p = (pointer)0x0;
          local_248.m_name._M_string_length = 0;
          lVar4 = 0;
          do {
            *(float *)((long)(&local_248.m_access.m_size + -6) + lVar4 * 4) =
                 *(float *)(local_278 + lVar4 * 4) - *(float *)((long)&local_258 + lVar4 * 4);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          local_1b8._0_8_ = (TestLog *)0x0;
          local_1b8._8_8_ = 0;
          lVar4 = 0;
          do {
            fVar2 = *(float *)((long)(&local_248.m_access.m_size + -6) + lVar4 * 4);
            fVar8 = -fVar2;
            if (-fVar2 <= fVar2) {
              fVar8 = fVar2;
            }
            *(float *)(local_1b8 + lVar4 * 4) = fVar8;
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          local_2b8.m_name._M_dataplus._M_p._0_4_ = 0;
          lVar4 = 0;
          do {
            *(bool *)((long)&local_2b8.m_name._M_dataplus._M_p + lVar4) =
                 *(float *)(local_1b8 + lVar4 * 4) <= *(float *)(local_278 + lVar4 * 4 + 0x10) &&
                 *(float *)(local_278 + lVar4 * 4 + 0x10) != *(float *)(local_1b8 + lVar4 * 4);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          local_338._M_dataplus._M_p._0_4_ = 0x1010101;
          bVar7 = true;
          lVar4 = 0;
          do {
            if (bVar7) {
              bVar7 = *(char *)((long)&local_2b8.m_name._M_dataplus._M_p + lVar4) ==
                      *(char *)((long)&local_338._M_dataplus._M_p + lVar4);
            }
            else {
              bVar7 = false;
            }
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          if (!bVar7) {
            poVar1 = (ostringstream *)(local_1b8 + 8);
            local_1b8._0_8_ = log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"Found (at least) one bad pixel at ",0x22);
            std::ostream::operator<<(poVar1,iVar5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,",",1);
            std::ostream::operator<<(poVar1,iVar3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,". Pixel color is not background color.",0x26);
            this = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_1b8,
                              (EndMessageToken *)&tcu::TestLog::EndMessage);
            local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"LayerContent","");
            local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"Layer content","")
            ;
            tcu::LogImageSet::LogImageSet(&local_2b8,&local_338,&local_2d8);
            tcu::TestLog::startImageSet
                      (this,(char *)CONCAT44(local_2b8.m_name._M_dataplus._M_p._4_4_,
                                             local_2b8.m_name._M_dataplus._M_p._0_4_),
                       local_2b8.m_description._M_dataplus._M_p);
            local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Layer","");
            local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"Layer","");
            tcu::LogImage::LogImage
                      (&local_248,&local_2f8,&local_318,image,QP_IMAGE_COMPRESSION_MODE_BEST);
            tcu::LogImage::write(&local_248,(int)this,__buf,(size_t)image);
            tcu::TestLog::endImageSet(this);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248.m_description._M_dataplus._M_p != &local_248.m_description.field_2) {
              operator_delete(local_248.m_description._M_dataplus._M_p,
                              local_248.m_description.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248.m_name._M_dataplus._M_p != &local_248.m_name.field_2) {
              operator_delete(local_248.m_name._M_dataplus._M_p,
                              local_248.m_name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_318._M_dataplus._M_p != &local_318.field_2) {
              operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
              operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8.m_description._M_dataplus._M_p != &local_2b8.m_description.field_2) {
              operator_delete(local_2b8.m_description._M_dataplus._M_p,
                              local_2b8.m_description.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_2b8.m_name._M_dataplus._M_p._4_4_,
                            local_2b8.m_name._M_dataplus._M_p._0_4_) != &local_2b8.m_name.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_2b8.m_name._M_dataplus._M_p._4_4_,
                                       local_2b8.m_name._M_dataplus._M_p._0_4_),
                              local_2b8.m_name.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
              operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_338._M_dataplus._M_p != &local_338.field_2) {
              operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b8 + 8));
            std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
            return bVar6;
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 < (image->m_size).m_data[0]);
      }
      iVar3 = iVar3 + 1;
      iVar5 = (image->m_size).m_data[1];
      bVar6 = iVar5 <= iVar3;
    } while (iVar3 < iVar5);
  }
  poVar1 = (ostringstream *)(local_1b8 + 8);
  local_1b8._0_8_ = log;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Image is valid",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x78));
  return bVar6;
}

Assistant:

bool verifyEmptyImage (tcu::TestLog& log, const tcu::ConstPixelBufferAccess image)
{
	log << tcu::TestLog::Message << "Expecting empty image" << tcu::TestLog::EndMessage;

	const Vec4	black		(0.0f, 0.0f, 0.0f, 1.0f);
	const Vec4	threshold	(0.02f);

	for (int y = 0; y < image.getHeight(); ++y)
	for (int x = 0; x < image.getWidth();  ++x)
	{
		const Vec4 color = image.getPixel(x, y);

		if (!compareColors(color, black, threshold))
		{
			log	<< tcu::TestLog::Message
				<< "Found (at least) one bad pixel at " << x << "," << y << ". Pixel color is not background color."
				<< tcu::TestLog::EndMessage
				<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
				<< tcu::TestLog::Image("Layer", "Layer", image)
				<< tcu::TestLog::EndImageSet;
			return false;
		}
	}

	log << tcu::TestLog::Message << "Image is valid" << tcu::TestLog::EndMessage;

	return true;
}